

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O1

void deserialize_bitset_incorrect_cardinality(void)

{
  uint8_t data [8201];
  undefined8 local_2018;
  undefined1 local_2010;
  undefined1 local_200f [8191];
  undefined1 local_10;
  
  local_2018 = 0xff0000000000303b;
  local_2010 = 0xff;
  memset(local_200f,0xff,0x2000);
  valid_deserialize_test(&local_2018,0x2009);
  local_10 = 0xfe;
  invalid_deserialize_test(&local_2018,0x2009,"Incorrect bitset cardinality");
  return;
}

Assistant:

DEFINE_TEST(deserialize_bitset_incorrect_cardinality) {
    // clang-format off
    const uint8_t data_begin[] = {
        0x3B, 0x30, // Serial Cookie
        0, 0,       // Container count - 1
        0,          // Run Flag Bitset (no runs)
        0, 0,       // Upper 16 bits of the first container
        0xFF, 0xFF, // Cardinality - 1 of the first container.

        // First container is a bitset, should be followed by 1 << 16 bits
    };
    // clang-format on
    uint8_t data[sizeof(data_begin) + (1 << 16) / 8];

    memcpy(data, data_begin, sizeof(data_begin));
    memset(data + sizeof(data_begin), 0xFF, (1 << 16) / 8);

    valid_deserialize_test(data, sizeof(data));

    data[sizeof(data) - 1] = 0xFE;
    invalid_deserialize_test(data, sizeof(data),
                             "Incorrect bitset cardinality");
}